

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xpath_number(lyxp_set **args,uint16_t arg_count,lyd_node *cur_node,lys_module *param_4,
                lyxp_set *set,int options)

{
  int iVar1;
  undefined6 in_register_00000032;
  
  if ((int)CONCAT62(in_register_00000032,arg_count) == 0) {
    iVar1 = lyxp_set_cast(set,LYXP_SET_NUMBER,cur_node,param_4,options);
    if (iVar1 != 0) {
      return -1;
    }
  }
  else {
    iVar1 = lyxp_set_cast(*args,LYXP_SET_NUMBER,cur_node,param_4,options);
    if (iVar1 != 0) {
      return -1;
    }
    set_fill_set(set,*args);
  }
  return 0;
}

Assistant:

static int
xpath_number(struct lyxp_set **args, uint16_t arg_count, struct lyd_node *cur_node, struct lys_module *local_mod,
             struct lyxp_set *set, int options)
{
    if (arg_count) {
        if (lyxp_set_cast(args[0], LYXP_SET_NUMBER, cur_node, local_mod, options)) {
            return -1;
        }
        set_fill_set(set, args[0]);
    } else {
        if (lyxp_set_cast(set, LYXP_SET_NUMBER, cur_node, local_mod, options)) {
            return -1;
        }
    }

    return EXIT_SUCCESS;
}